

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack-opts.cpp
# Opt level: O2

bool __thiscall wasm::StackIROptimizer::isControlFlowEnd(StackIROptimizer *this,StackInst *inst)

{
  return (bool)((byte)(0x58a4 >> ((byte)inst->op & 0x1f)) & inst->op < (TryTableEnd|BlockBegin));
}

Assistant:

bool StackIROptimizer::isControlFlowEnd(StackInst* inst) {
  switch (inst->op) {
    case StackInst::BlockEnd:
    case StackInst::IfEnd:
    case StackInst::LoopEnd:
    case StackInst::TryEnd:
    case StackInst::Delegate:
    case StackInst::TryTableEnd: {
      return true;
    }
    default: {
      return false;
    }
  }
}